

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_resources(Compiler *compiler,StorageClass storage,
                    SmallVector<spirv_cross::BuiltInResource,_8UL> *resources)

{
  int iVar1;
  FILE *__stream;
  SPIRType *pSVar2;
  bool bVar3;
  uint *puVar4;
  bool *pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  __cxx11 local_188 [39];
  allocator local_161;
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  string local_120 [8];
  string builtin_str;
  spirv_cross local_100 [32];
  spirv_cross local_e0 [32];
  __cxx11 local_c0 [55];
  allocator local_89;
  string local_88 [8];
  string type_str;
  byte local_61;
  uint local_60;
  TypeID TStack_5c;
  bool array_size_literal;
  uint32_t array_size;
  SPIRType *type;
  char *basetype;
  BuiltInResource *pBStack_40;
  bool active;
  BuiltInResource *res;
  BuiltInResource *__end1;
  BuiltInResource *__begin1;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *__range1;
  SmallVector<spirv_cross::BuiltInResource,_8UL> *resources_local;
  Compiler *pCStack_10;
  StorageClass storage_local;
  Compiler *compiler_local;
  
  pcVar8 = "builtin outputs";
  if (storage == StorageClassInput) {
    pcVar8 = "builtin inputs";
  }
  __range1 = resources;
  resources_local._4_4_ = storage;
  pCStack_10 = compiler;
  fprintf(_stderr,"%s\n",pcVar8);
  fprintf(_stderr,"=============\n\n");
  __begin1 = (BuiltInResource *)__range1;
  __end1 = spirv_cross::VectorView<spirv_cross::BuiltInResource>::begin
                     (&__range1->super_VectorView<spirv_cross::BuiltInResource>);
  res = spirv_cross::VectorView<spirv_cross::BuiltInResource>::end
                  ((VectorView<spirv_cross::BuiltInResource> *)__begin1);
  for (; __end1 != res; __end1 = __end1 + 1) {
    pBStack_40 = __end1;
    basetype._7_1_ =
         spirv_cross::Compiler::has_active_builtin(pCStack_10,__end1->builtin,resources_local._4_4_)
    ;
    type = (SPIRType *)0x5df407;
    TStack_5c.id = (pBStack_40->value_type_id).id;
    _array_size = spirv_cross::Compiler::get_type(pCStack_10,TStack_5c);
    iVar1 = *(int *)&(_array_size->super_IVariant).field_0xc;
    if (iVar1 == 7) {
      type = (SPIRType *)0x5ec05f;
    }
    else if (iVar1 == 8) {
      type = (SPIRType *)0x5f7001;
    }
    else if (iVar1 == 0xd) {
      type = (SPIRType *)0x5eff4a;
    }
    local_60 = 0;
    local_61 = 0;
    bVar3 = spirv_cross::VectorView<unsigned_int>::empty
                      (&(_array_size->array).super_VectorView<unsigned_int>);
    if (!bVar3) {
      puVar4 = spirv_cross::VectorView<unsigned_int>::front
                         (&(_array_size->array).super_VectorView<unsigned_int>);
      local_60 = *puVar4;
      pbVar5 = spirv_cross::VectorView<bool>::front
                         (&(_array_size->array_size_literal).super_VectorView<bool>);
      local_61 = *pbVar5 & 1;
    }
    pSVar2 = type;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,(char *)pSVar2,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (1 < _array_size->vecsize) {
      std::__cxx11::to_string(local_c0,_array_size->vecsize);
      std::__cxx11::string::operator+=(local_88,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
    }
    if (local_60 != 0) {
      if (local_61 == 0) {
        spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[21]>
                  (local_100,(char (*) [2])0x5ee639,&local_60,(char (*) [21])" (spec constant ID)]")
        ;
        std::__cxx11::string::operator+=(local_88,(string *)local_100);
        std::__cxx11::string::~string((string *)local_100);
      }
      else {
        spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  (local_e0,(char (*) [2])0x5ee639,&local_60,(char (*) [2])0x5ee53e);
        std::__cxx11::string::operator+=(local_88,(string *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    std::__cxx11::string::string(local_120);
    switch(pBStack_40->builtin) {
    case BuiltInPosition:
      std::__cxx11::string::operator=(local_120,"Position");
      break;
    case BuiltInPointSize:
      std::__cxx11::string::operator=(local_120,"PointSize");
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"builtin #",&local_161);
      std::__cxx11::to_string(local_188,pBStack_40->builtin);
      std::operator+(local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::__cxx11::string::operator=(local_120,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      break;
    case BuiltInClipDistance:
      std::__cxx11::string::operator=(local_120,"ClipDistance");
      break;
    case BuiltInCullDistance:
      std::__cxx11::string::operator=(local_120,"CullDistance");
      break;
    case BuiltInTessLevelOuter:
      std::__cxx11::string::operator=(local_120,"TessLevelOuter");
      break;
    case BuiltInTessLevelInner:
      std::__cxx11::string::operator=(local_120,"TessLevelInner");
    }
    __stream = _stderr;
    uVar6 = std::__cxx11::string::c_str();
    uVar7 = std::__cxx11::string::c_str();
    pcVar8 = "no";
    if ((basetype._7_1_ & 1) != 0) {
      pcVar8 = "yes";
    }
    fprintf(__stream,"Builtin %s (%s) (active: %s).\n",uVar6,uVar7,pcVar8);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_88);
  }
  fprintf(_stderr,"=============\n\n");
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, spv::StorageClass storage,
                            const SmallVector<BuiltInResource> &resources)
{
	fprintf(stderr, "%s\n", storage == StorageClassInput ? "builtin inputs" : "builtin outputs");
	fprintf(stderr, "=============\n\n");
	for (auto &res : resources)
	{
		bool active = compiler.has_active_builtin(res.builtin, storage);
		const char *basetype = "?";
		auto &type = compiler.get_type(res.value_type_id);
		switch (type.basetype)
		{
		case SPIRType::Float: basetype = "float"; break;
		case SPIRType::Int: basetype = "int"; break;
		case SPIRType::UInt: basetype = "uint"; break;
		default: break;
		}

		uint32_t array_size = 0;
		bool array_size_literal = false;
		if (!type.array.empty())
		{
			array_size = type.array.front();
			array_size_literal = type.array_size_literal.front();
		}

		string type_str = basetype;
		if (type.vecsize > 1)
			type_str += std::to_string(type.vecsize);

		if (array_size)
		{
			if (array_size_literal)
				type_str += join("[", array_size, "]");
			else
				type_str += join("[", array_size, " (spec constant ID)]");
		}

		string builtin_str;
		switch (res.builtin)
		{
		case spv::BuiltInPosition: builtin_str = "Position"; break;
		case spv::BuiltInPointSize: builtin_str = "PointSize"; break;
		case spv::BuiltInCullDistance: builtin_str = "CullDistance"; break;
		case spv::BuiltInClipDistance: builtin_str = "ClipDistance"; break;
		case spv::BuiltInTessLevelInner: builtin_str = "TessLevelInner"; break;
		case spv::BuiltInTessLevelOuter: builtin_str = "TessLevelOuter"; break;
		default: builtin_str = string("builtin #") + to_string(res.builtin);
		}

		fprintf(stderr, "Builtin %s (%s) (active: %s).\n", builtin_str.c_str(), type_str.c_str(), active ? "yes" : "no");
	}
	fprintf(stderr, "=============\n\n");
}